

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.h
# Opt level: O0

int32_t __thiscall icu_63::UVector32::push(UVector32 *this,int32_t i,UErrorCode *status)

{
  UErrorCode *status_local;
  int32_t i_local;
  UVector32 *this_local;
  
  addElement(this,i,status);
  return i;
}

Assistant:

inline int32_t UVector32::push(int32_t i, UErrorCode &status) {
    addElement(i, status);
    return i;
}